

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_rcbuf.c
# Opt level: O0

int nghttp2_rcbuf_new(nghttp2_rcbuf **rcbuf_ptr,size_t size,nghttp2_mem *mem)

{
  nghttp2_rcbuf *pnVar1;
  uint8_t *p;
  nghttp2_mem *mem_local;
  size_t size_local;
  nghttp2_rcbuf **rcbuf_ptr_local;
  
  pnVar1 = (nghttp2_rcbuf *)nghttp2_mem_malloc(mem,size + 0x28);
  if (pnVar1 == (nghttp2_rcbuf *)0x0) {
    rcbuf_ptr_local._4_4_ = -0x385;
  }
  else {
    *rcbuf_ptr = pnVar1;
    (*rcbuf_ptr)->mem_user_data = mem->mem_user_data;
    (*rcbuf_ptr)->free = mem->free;
    (*rcbuf_ptr)->base = (uint8_t *)(pnVar1 + 1);
    (*rcbuf_ptr)->len = size;
    (*rcbuf_ptr)->ref = 1;
    rcbuf_ptr_local._4_4_ = 0;
  }
  return rcbuf_ptr_local._4_4_;
}

Assistant:

int nghttp2_rcbuf_new(nghttp2_rcbuf **rcbuf_ptr, size_t size,
                      nghttp2_mem *mem) {
  uint8_t *p;

  p = nghttp2_mem_malloc(mem, sizeof(nghttp2_rcbuf) + size);
  if (p == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  *rcbuf_ptr = (void *)p;

  (*rcbuf_ptr)->mem_user_data = mem->mem_user_data;
  (*rcbuf_ptr)->free = mem->free;
  (*rcbuf_ptr)->base = p + sizeof(nghttp2_rcbuf);
  (*rcbuf_ptr)->len = size;
  (*rcbuf_ptr)->ref = 1;

  return 0;
}